

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O2

float __thiscall
quantileloss::getUnsafeUpdate(quantileloss *this,float prediction,float label,float update_scale)

{
  float fVar1;
  
  fVar1 = label - prediction;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return 0.0;
  }
  if (0.0 < fVar1) {
    return this->tau * update_scale;
  }
  return -(1.0 - this->tau) * update_scale;
}

Assistant:

float getUnsafeUpdate(float prediction, float label, float update_scale)
  {
    float err = label - prediction;
    if (err == 0)
      return 0;
    if (err > 0)
      return tau * update_scale;
    return -(1 - tau) * update_scale;
  }